

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_file.cc
# Opt level: O3

void google::protobuf::compiler::java::anon_unknown_0::MaybeRestartJavaMethod
               (Printer *printer,int *bytecode_estimate,int *method_num,char *chain_statement,
               char *method_decl)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  undefined8 uVar3;
  char local_80 [32];
  char *local_60;
  int *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (0x8000 < *bytecode_estimate) {
    iVar2 = *method_num;
    *method_num = iVar2 + 1;
    local_60 = method_decl;
    local_58 = bytecode_estimate;
    uVar3 = google::protobuf::FastInt32ToBufferLeft(iVar2 + 1,local_80);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,local_80,uVar3);
    io::Printer::Print<char[11],std::__cxx11::string>
              (printer,chain_statement,(char (*) [11])"method_num",&local_50);
    paVar1 = &local_50.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    google::protobuf::io::Printer::Outdent();
    io::Printer::Print<>(printer,"}\n");
    uVar3 = google::protobuf::FastInt32ToBufferLeft(*method_num,local_80);
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,local_80,uVar3);
    io::Printer::Print<char[11],std::__cxx11::string>
              (printer,local_60,(char (*) [11])"method_num",&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    google::protobuf::io::Printer::Indent();
    *local_58 = 0;
  }
  return;
}

Assistant:

void MaybeRestartJavaMethod(io::Printer* printer, int* bytecode_estimate,
                            int* method_num, const char* chain_statement,
                            const char* method_decl) {
  // The goal here is to stay under 64K bytes of jvm bytecode/method,
  // since otherwise we hit a hardcoded limit in the jvm and javac will
  // then fail with the error "code too large". This limit lets our
  // estimates be off by a factor of two and still we're okay.
  static const int bytesPerMethod = kMaxStaticSize;

  if ((*bytecode_estimate) > bytesPerMethod) {
    ++(*method_num);
    printer->Print(chain_statement, "method_num", StrCat(*method_num));
    printer->Outdent();
    printer->Print("}\n");
    printer->Print(method_decl, "method_num", StrCat(*method_num));
    printer->Indent();
    *bytecode_estimate = 0;
  }
}